

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_twolevel.h
# Opt level: O2

QuadMesh * __thiscall
embree::avx::BVHNBuilderTwoLevel<8,_embree::QuadMesh,_embree::QuadMv<4>_>::getMesh
          (BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_> *this,size_t objectID
          )

{
  QuadMesh *pQVar1;
  QuadMesh *pQVar2;
  
  pQVar1 = (QuadMesh *)(this->scene->geometries).items[objectID].ptr;
  pQVar2 = (QuadMesh *)0x0;
  if ((pQVar1 != (QuadMesh *)0x0) && (*(char *)&(pQVar1->super_Geometry).field_8 == '\x15')) {
    pQVar2 = pQVar1;
  }
  return pQVar2;
}

Assistant:

Mesh* getMesh (size_t objectID) {
        return this->scene->template getSafe<Mesh>(objectID);
      }